

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.cpp
# Opt level: O2

string * pprint__abi_cxx11_(string *__return_storage_ptr__,thing *t,int i)

{
  int iVar1;
  char cVar2;
  int j;
  ulong uVar3;
  int iVar4;
  bool bVar5;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar1 = 0;
  iVar4 = 0;
  if (0 < i) {
    iVar1 = i;
    iVar4 = i;
  }
  while( true ) {
    cVar2 = (char)__return_storage_ptr__;
    if (iVar1 == 0) break;
    std::__cxx11::string::push_back(cVar2);
    iVar1 = iVar1 + -1;
  }
  if (t->t == TOKEN) {
    std::__cxx11::string::string((string *)&local_50,(string *)(t + 2));
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else if (t->t == EXPRESSION) {
    std::__cxx11::string::push_back(cVar2);
    std::__cxx11::string::push_back(cVar2);
    for (uVar3 = 0; uVar3 < (ulong)(*(long *)(t + 4) - *(long *)(t + 2) >> 3); uVar3 = uVar3 + 1) {
      pprint__abi_cxx11_(&local_50,*(thing **)(*(long *)(t + 2) + uVar3 * 8),i + 1);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::push_back(cVar2);
    }
    while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
      std::__cxx11::string::push_back(cVar2);
    }
    std::__cxx11::string::push_back(cVar2);
    std::__cxx11::string::push_back(cVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string pprint_(parser::thing *t, int i) {

  std::string s;

  for (int j = 0; j < i; j++) {
    s.push_back('\t');
  }

  if (t->t==parser::type::TOKEN) {
    s += ((static_cast<parser::token *>(t))->get_content());
  } else if (t->t==parser::type::EXPRESSION) {

    s.push_back('(');
    s.push_back('\n');

    parser::expression *e = static_cast<parser::expression *>(t);

    for (int j = 0; j < e->things.size(); j++) {
      s += pprint_(e->things[j], i + 1);
      s.push_back('\n');
    }

    for (int j = 0; j < i; j++) {
      s.push_back('\t');
    }

    s.push_back(')');
    s.push_back('\n');

  }

  return s;

}